

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O1

Vector * SSORIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType Dummy,double Omega)

{
  bool bVar1;
  LASErrIdType LVar2;
  Boolean BVar3;
  size_t Dim;
  Vector *pVVar4;
  QMatrix *pQVar5;
  QMatrix *pQVar6;
  QMatrix *pQVar7;
  QMatrix *Q2;
  int Iter;
  double bNorm;
  double dVar8;
  undefined1 auVar9 [16];
  Vector r;
  Vector local_60;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&local_60,"r",Dim,Normal,True);
  LVar2 = LASResult();
  if (LVar2 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar8 = l1Norm_V(x);
    auVar9._8_4_ = (int)(Dim >> 0x20);
    auVar9._0_8_ = Dim;
    auVar9._12_4_ = 0x45300000;
    pVVar4 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar8 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar3 = Q_KerDefined(A);
      if (BVar3 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar4 = Mul_QV(A,x);
      pVVar4 = Sub_VV(b,pVVar4);
    }
    Asgn_VV(&local_60,pVVar4);
    dVar8 = l2Norm_V(&local_60);
    BVar3 = RTCResult(0,dVar8,bNorm,SSORIterId);
    if (0 < MaxIter && BVar3 == False) {
      Iter = 1;
      do {
        pQVar5 = Diag_Q(A);
        pQVar5 = Mul_SQ(1.0 / Omega,pQVar5);
        pQVar6 = Upper_Q(A);
        pQVar5 = Add_QQ(pQVar5,pQVar6);
        pQVar6 = Diag_Q(A);
        pQVar7 = Diag_Q(A);
        pQVar7 = Mul_SQ(1.0 / Omega,pQVar7);
        Q2 = Lower_Q(A);
        pQVar7 = Add_QQ(pQVar7,Q2);
        pVVar4 = MulInv_QV(pQVar7,&local_60);
        pVVar4 = Mul_QV(pQVar6,pVVar4);
        pVVar4 = MulInv_QV(pQVar5,pVVar4);
        pVVar4 = Mul_SV((2.0 - Omega) / Omega,pVVar4);
        AddAsgn_VV(x,pVVar4);
        BVar3 = Q_KerDefined(A);
        if (BVar3 != False) {
          OrthoRightKer_VQ(x,A);
        }
        if (Iter < MaxIter) {
          pVVar4 = Mul_QV(A,x);
          pVVar4 = Sub_VV(b,pVVar4);
          Asgn_VV(&local_60,pVVar4);
        }
        dVar8 = l2Norm_V(&local_60);
        BVar3 = RTCResult(Iter,dVar8,bNorm,SSORIterId);
      } while ((BVar3 == False) && (bVar1 = Iter < MaxIter, Iter = Iter + 1, bVar1));
    }
  }
  V_Destr(&local_60);
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *SSORIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType Dummy, double Omega)
{
    (void) Dummy;
    
    int Iter;
    double bNorm;
    size_t Dim;
    Vector r;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);

        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        while (!RTCResult(Iter, l2Norm_V(&r), bNorm, SSORIterId)
            && Iter < MaxIter) {
            Iter++;
            /* x(i+1) = x(i) + (2 - Omega) * (Diag(A) / Omega + Upper(A))^(-1)
                   * Diag(A) / Omega * (Diag(A) / Omega + Lower(A))^(-1) r */
            AddAsgn_VV(x, Mul_SV((2.0 - Omega) / Omega,
                MulInv_QV(Add_QQ(Mul_SQ(1.0 / Omega, Diag_Q(A)), Upper_Q(A)),
                Mul_QV(Diag_Q(A),
                MulInv_QV(Add_QQ(Mul_SQ(1.0 / Omega, Diag_Q(A)), Lower_Q(A)), &r)))));
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            /* r = b - A * x(i) */
            if (Iter < MaxIter)
                Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        }
    }

    V_Destr(&r);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}